

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

_Bool cs_support(int query)

{
  int query_local;
  undefined1 local_1;
  
  if (query == 0xffff) {
    local_1 = all_arch == 0x1fff;
  }
  else if ((uint)query < 0xd) {
    local_1 = (all_arch & 1 << ((byte)query & 0x1f)) != 0;
  }
  else if (query == 0x10000) {
    local_1 = false;
  }
  else if (query == 0x10001) {
    local_1 = false;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

CAPSTONE_API cs_support(int query)
{
	if (query == CS_ARCH_ALL)
		return all_arch == ((1 << CS_ARCH_ARM) | (1 << CS_ARCH_ARM64) |
				(1 << CS_ARCH_MIPS) | (1 << CS_ARCH_X86) |
				(1 << CS_ARCH_PPC) | (1 << CS_ARCH_SPARC) |
				(1 << CS_ARCH_SYSZ) | (1 << CS_ARCH_XCORE) |
				(1 << CS_ARCH_M68K) | (1 << CS_ARCH_TMS320C64X) |
				(1 << CS_ARCH_M680X) | (1 << CS_ARCH_EVM) |
				(1 << CS_ARCH_MOS65XX));

	if ((unsigned int)query < CS_ARCH_MAX)
		return all_arch & (1 << query);

	if (query == CS_SUPPORT_DIET) {
#ifdef CAPSTONE_DIET
		return true;
#else
		return false;
#endif
	}

	if (query == CS_SUPPORT_X86_REDUCE) {
#if defined(CAPSTONE_HAS_X86) && defined(CAPSTONE_X86_REDUCE)
		return true;
#else
		return false;
#endif
	}

	// unsupported query
	return false;
}